

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O0

OPJ_BOOL opj_get_decoded_tile
                   (opj_codec_t *p_codec,opj_stream_t *p_stream,opj_image_t *p_image,
                   OPJ_UINT32 tile_index)

{
  opj_stream_private_t *l_stream;
  opj_codec_private_t *l_codec;
  OPJ_UINT32 tile_index_local;
  opj_image_t *p_image_local;
  opj_stream_t *p_stream_local;
  opj_codec_t *p_codec_local;
  
  if ((p_codec == (opj_codec_t *)0x0) || (p_stream == (opj_stream_t *)0x0)) {
    p_codec_local._4_4_ = 0;
  }
  else if (*(int *)(p_codec + 0x12) == 0) {
    p_codec_local._4_4_ = 0;
  }
  else {
    p_codec_local._4_4_ =
         (*(code *)p_codec[8])(p_codec[0xb],p_stream,p_image,p_codec + 0xc,tile_index);
  }
  return p_codec_local._4_4_;
}

Assistant:

OPJ_BOOL OPJ_CALLCONV opj_get_decoded_tile(opj_codec_t *p_codec,
        opj_stream_t *p_stream,
        opj_image_t *p_image,
        OPJ_UINT32 tile_index)
{
    if (p_codec && p_stream) {
        opj_codec_private_t * l_codec = (opj_codec_private_t *) p_codec;
        opj_stream_private_t * l_stream = (opj_stream_private_t *) p_stream;

        if (! l_codec->is_decompressor) {
            return OPJ_FALSE;
        }

        return l_codec->m_codec_data.m_decompression.opj_get_decoded_tile(
                   l_codec->m_codec,
                   l_stream,
                   p_image,
                   &(l_codec->m_event_mgr),
                   tile_index);
    }

    return OPJ_FALSE;
}